

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O3

bool tinyusdz::prim::ReconstructPrim<tinyusdz::GeomCylinder>
               (Specifier *spec,PropertyMap *properties,ReferenceList *references,
               GeomCylinder *cylinder,string *warn,string *err,PrimReconstructOptions *options)

{
  Property *prop;
  size_type *psVar1;
  _Base_ptr __k;
  uint uVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  long *plVar6;
  const_iterator cVar7;
  mapped_type *pmVar8;
  _Base_ptr p_Var9;
  size_type *psVar10;
  string *psVar11;
  _Rb_tree_header *p_Var12;
  bool bVar13;
  ParseResult ret;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  table;
  ostringstream ss_e;
  string local_2d0;
  undefined1 local_2b0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_298;
  TypedAttributeWithFallback<tinyusdz::Axis> *local_288;
  long *local_280 [2];
  long local_270 [2];
  string *local_260;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *local_258;
  TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *local_250;
  _Base_ptr local_248;
  TypedAttributeWithFallback<tinyusdz::Animatable<double>_> *local_240;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238;
  _Any_data local_208;
  code *local_1f8;
  code *pcStack_1f0;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [16];
  code *local_198;
  code *pcStack_190;
  ios_base local_138 [264];
  
  local_238._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_238._M_t._M_impl.super__Rb_tree_header._M_header;
  local_238._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bVar13 = false;
  local_238._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_238._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_238._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_238._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar3 = anon_unknown_0::ReconstructGPrimProperties
                    (spec,&local_238,properties,&cylinder->super_GPrim,warn,err,
                     options->strict_allowedToken_check);
  if (bVar3) {
    p_Var9 = (properties->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var12 = &(properties->_M_t)._M_impl.super__Rb_tree_header;
    bVar13 = true;
    if ((_Rb_tree_header *)p_Var9 != p_Var12) {
      local_240 = &cylinder->radius;
      local_250 = &cylinder->height;
      local_258 = &(cylinder->super_GPrim).props;
      local_288 = &cylinder->axis;
      local_260 = warn;
      local_248 = &p_Var12->_M_header;
      do {
        local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1c8,*(long *)(p_Var9 + 1),
                   (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
        prop = (Property *)(p_Var9 + 2);
        local_1a8._0_8_ = &local_198;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"radius","");
        psVar11 = (string *)local_1a8;
        anon_unknown_0::ParseTypedAttribute<double>
                  ((ParseResult *)local_2b0,&local_238,&local_1c8,prop,(string *)local_1a8,local_240
                  );
        if ((code **)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        iVar4 = 0;
        if ((local_2b0._0_8_ & 0xfffffffd) == 0) {
          iVar4 = 3;
LAB_0021568f:
          bVar3 = false;
        }
        else {
          bVar3 = true;
          if (local_2b0._0_4_ != Unmatched) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar5 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0xdca);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            local_280[0] = local_270;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_280,"Parsing attribute `{}` failed. Error: {}","");
            fmt::format<char[7],std::__cxx11::string>
                      (&local_2d0,(fmt *)local_280,(string *)0x3de6c0,(char (*) [7])(local_2b0 + 8),
                       psVar11);
            poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,local_2d0._M_dataplus._M_p,
                                local_2d0._M_string_length);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
              operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_280[0] != local_270) {
              operator_delete(local_280[0],local_270[0] + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar6 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)local_280,(ulong)(err->_M_dataplus)._M_p);
              psVar1 = (size_type *)(plVar6 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar6 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar1) {
                local_2d0.field_2._M_allocated_capacity = *psVar1;
                local_2d0.field_2._8_8_ = plVar6[3];
                local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
              }
              else {
                local_2d0.field_2._M_allocated_capacity = *psVar1;
                local_2d0._M_dataplus._M_p = (pointer)*plVar6;
              }
              local_2d0._M_string_length = plVar6[1];
              *plVar6 = (long)psVar1;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)&local_2d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                operator_delete(local_2d0._M_dataplus._M_p,
                                local_2d0.field_2._M_allocated_capacity + 1);
              }
              if (local_280[0] != local_270) {
                operator_delete(local_280[0],local_270[0] + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
            iVar4 = 1;
            goto LAB_0021568f;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._8_8_ != &aStack_298) {
          operator_delete((void *)local_2b0._8_8_,aStack_298._M_allocated_capacity + 1);
        }
        if (bVar3) {
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1e8,*(long *)(p_Var9 + 1),
                     (long)&(p_Var9[1]._M_parent)->_M_color + *(long *)(p_Var9 + 1));
          local_1a8._0_8_ = &local_198;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"height","");
          psVar11 = (string *)local_1a8;
          anon_unknown_0::ParseTypedAttribute<double>
                    ((ParseResult *)local_2b0,&local_238,&local_1e8,prop,(string *)local_1a8,
                     local_250);
          if ((code **)local_1a8._0_8_ != &local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          iVar4 = 0;
          if ((local_2b0._0_8_ & 0xfffffffd) == 0) {
            iVar4 = 3;
LAB_0021598b:
            bVar3 = false;
          }
          else {
            bVar3 = true;
            if (local_2b0._0_4_ != Unmatched) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                         ,0x5a);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1a8,"ReconstructPrim",0xf);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
              poVar5 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0xdcc);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
              local_280[0] = local_270;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_280,"Parsing attribute `{}` failed. Error: {}","");
              fmt::format<char[7],std::__cxx11::string>
                        (&local_2d0,(fmt *)local_280,(string *)0x3de6f3,
                         (char (*) [7])(local_2b0 + 8),psVar11);
              poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                                 ((ostream *)local_1a8,local_2d0._M_dataplus._M_p,
                                  local_2d0._M_string_length);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                operator_delete(local_2d0._M_dataplus._M_p,
                                local_2d0.field_2._M_allocated_capacity + 1);
              }
              if (local_280[0] != local_270) {
                operator_delete(local_280[0],local_270[0] + 1);
              }
              if (err != (string *)0x0) {
                ::std::__cxx11::stringbuf::str();
                plVar6 = (long *)::std::__cxx11::string::_M_append
                                           ((char *)local_280,(ulong)(err->_M_dataplus)._M_p);
                psVar1 = (size_type *)(plVar6 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar6 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar1) {
                  local_2d0.field_2._M_allocated_capacity = *psVar1;
                  local_2d0.field_2._8_8_ = plVar6[3];
                  local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                }
                else {
                  local_2d0.field_2._M_allocated_capacity = *psVar1;
                  local_2d0._M_dataplus._M_p = (pointer)*plVar6;
                }
                local_2d0._M_string_length = plVar6[1];
                *plVar6 = (long)psVar1;
                plVar6[1] = 0;
                *(undefined1 *)(plVar6 + 2) = 0;
                ::std::__cxx11::string::operator=((string *)err,(string *)&local_2d0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                  operator_delete(local_2d0._M_dataplus._M_p,
                                  local_2d0.field_2._M_allocated_capacity + 1);
                }
                if (local_280[0] != local_270) {
                  operator_delete(local_280[0],local_270[0] + 1);
                }
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
              ::std::ios_base::~ios_base(local_138);
              iVar4 = 1;
              goto LAB_0021598b;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b0._8_8_ != &aStack_298) {
            operator_delete((void *)local_2b0._8_8_,aStack_298._M_allocated_capacity + 1);
          }
          if (!bVar3) goto LAB_00215f3d;
          __k = p_Var9 + 1;
          iVar4 = ::std::__cxx11::string::compare((char *)__k);
          if (iVar4 != 0) {
            cVar7 = ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_238,(key_type *)__k);
            p_Var12 = &local_238._M_t._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)cVar7._M_node == p_Var12) {
              pmVar8 = ::std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                       ::operator[](local_258,(key_type *)__k);
              ::std::__cxx11::string::_M_assign((string *)pmVar8);
              (pmVar8->_attrib)._varying_authored = (bool)p_Var9[3].field_0x4;
              (pmVar8->_attrib)._variability = p_Var9[3]._M_color;
              ::std::__cxx11::string::_M_assign((string *)&(pmVar8->_attrib)._type_name);
              linb::any::operator=((any *)&(pmVar8->_attrib)._var,(any *)&p_Var9[4]._M_parent);
              (pmVar8->_attrib)._var._blocked = SUB41(p_Var9[5]._M_color,0);
              ::std::
              vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
              ::operator=(&(pmVar8->_attrib)._var._ts._samples,
                          (vector<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                           *)&p_Var9[5]._M_parent);
              (pmVar8->_attrib)._var._ts._dirty = SUB41(p_Var9[6]._M_color,0);
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &(pmVar8->_attrib)._paths,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &p_Var9[6]._M_parent);
              AttrMetas::operator=(&(pmVar8->_attrib)._metas,(AttrMetas *)(p_Var9 + 7));
              *(_Base_ptr *)&pmVar8->_listOpQual = p_Var9[0x17]._M_parent;
              (pmVar8->_rel).type = *(Type *)&p_Var9[0x17]._M_left;
              Path::operator=(&(pmVar8->_rel).targetPath,(Path *)&p_Var9[0x17]._M_right);
              std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
                        ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &(pmVar8->_rel).targetPathVector,
                         (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                         &p_Var9[0x1e]._M_parent);
              (pmVar8->_rel).listOpQual = p_Var9[0x1f]._M_color;
              AttrMetas::operator=(&(pmVar8->_rel)._metas,(AttrMetas *)&p_Var9[0x1f]._M_parent);
              (pmVar8->_rel)._varying_authored = *(bool *)&p_Var9[0x2f]._M_left;
              ::std::__cxx11::string::_M_assign((string *)&pmVar8->_prop_value_type_name);
              pmVar8->_has_custom = *(bool *)&p_Var9[0x30]._M_right;
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string_const&>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_238,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k);
            }
            cVar7 = ::std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_238,(key_type *)__k);
            if ((_Rb_tree_header *)cVar7._M_node != p_Var12) goto LAB_00215f4c;
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                       ,0x5a);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"ReconstructPrim",0xf);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
            poVar5 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0xdcf);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
            ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_2b0,"Unsupported/unimplemented property: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             __k);
            poVar5 = ::std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_1a8,(char *)local_2b0._0_8_,local_2b0._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
            psVar1 = (size_type *)(local_2b0 + 0x10);
            if ((size_type *)local_2b0._0_8_ != psVar1) {
              operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
            }
            if (err != (string *)0x0) {
              ::std::__cxx11::stringbuf::str();
              plVar6 = (long *)::std::__cxx11::string::_M_append
                                         ((char *)&local_2d0,(ulong)(err->_M_dataplus)._M_p);
              psVar10 = (size_type *)(plVar6 + 2);
              if ((size_type *)*plVar6 == psVar10) {
                local_2b0._16_8_ = *psVar10;
                aStack_298._M_allocated_capacity = plVar6[3];
                local_2b0._0_8_ = psVar1;
              }
              else {
                local_2b0._16_8_ = *psVar10;
                local_2b0._0_8_ = (size_type *)*plVar6;
              }
              local_2b0._8_8_ = plVar6[1];
              *plVar6 = (long)psVar10;
              plVar6[1] = 0;
              *(undefined1 *)(plVar6 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)err,(string *)local_2b0);
              if ((size_type *)local_2b0._0_8_ != psVar1) {
                operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                operator_delete(local_2d0._M_dataplus._M_p,
                                local_2d0.field_2._M_allocated_capacity + 1);
              }
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            ::std::ios_base::~ios_base(local_138);
            goto LAB_00216217;
          }
          local_1a8._0_8_ = &local_198;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"axis","");
          cVar7 = ::std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_238,(string *)local_1a8);
          if ((code **)local_1a8._0_8_ != &local_198) {
            operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
          }
          if ((_Rb_tree_header *)cVar7._M_node == &local_238._M_t._M_impl.super__Rb_tree_header) {
            if (((ulong)p_Var9[0x17]._M_parent & 0xfffffffe00000000) != 0x200000000) {
              Attribute::type_name_abi_cxx11_((string *)local_1a8,(Attribute *)prop);
              local_2b0._0_8_ = local_2b0 + 0x10;
              local_2b0._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x5;
              local_2b0._16_6_ = 0x6e656b6f74;
              if (((local_1a8._8_8_ == 5) &&
                  ((char)*(int *)(local_1a8._0_8_ + 4) == 'n' &&
                   *(int *)local_1a8._0_8_ == 0x656b6f74)) &&
                 (uVar2 = *(uint *)((long)&p_Var9[0x17]._M_parent + 4), uVar2 < 2)) {
                if ((code **)local_1a8._0_8_ != &local_198) {
                  operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
                }
                if (uVar2 == 0) {
                  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"[warn]",6);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,
                             "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/prim-reconstruct.cc"
                             ,0x5a);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"ReconstructPrim",0xf);
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3)
                  ;
                  poVar5 = (ostream *)::std::ostream::operator<<((string *)local_1a8,0xdcd);
                  ::std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"No value assigned to `",0x16);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"axis",4);
                  ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,"` token attribute. Set default token value.",0x2b
                            );
                  ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
                  psVar11 = local_260;
                  if (local_260 != (string *)0x0) {
                    ::std::__cxx11::stringbuf::str();
                    plVar6 = (long *)::std::__cxx11::string::_M_append
                                               ((char *)&local_2d0,(ulong)(err->_M_dataplus)._M_p);
                    psVar1 = (size_type *)(plVar6 + 2);
                    if ((size_type *)*plVar6 == psVar1) {
                      local_2b0._16_8_ = *psVar1;
                      aStack_298._M_allocated_capacity = plVar6[3];
                      local_2b0._0_8_ = local_2b0 + 0x10;
                    }
                    else {
                      local_2b0._16_8_ = *psVar1;
                      local_2b0._0_8_ = (size_type *)*plVar6;
                    }
                    local_2b0._8_8_ = plVar6[1];
                    *plVar6 = (long)psVar1;
                    plVar6[1] = 0;
                    *(undefined1 *)(plVar6 + 2) = 0;
                    ::std::__cxx11::string::operator=((string *)psVar11,(string *)local_2b0);
                    if ((undefined1 *)local_2b0._0_8_ != local_2b0 + 0x10) {
                      operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                      operator_delete(local_2d0._M_dataplus._M_p,
                                      local_2d0.field_2._M_allocated_capacity + 1);
                    }
                  }
                  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
                  ::std::ios_base::~ios_base(local_138);
                  AttrMetas::operator=(&local_288->_metas,(AttrMetas *)(p_Var9 + 7));
                  local_1a8._0_8_ = &local_198;
                  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"axis","");
                  ::std::
                  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  ::_M_insert_unique<std::__cxx11::string>
                            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                              *)&local_238,(string *)local_1a8);
                  if ((code **)local_1a8._0_8_ != &local_198) {
                    operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
                  }
                  goto LAB_00215f4c;
                }
              }
              else if ((code **)local_1a8._0_8_ != &local_198) {
                operator_delete((void *)local_1a8._0_8_,(ulong)((long)local_198 + 1));
              }
            }
            local_1a8._8_8_ = 0;
            local_1a8._0_8_ = AxisEnumHandler;
            pcStack_190 = ::std::
                          _Function_handler<nonstd::expected_lite::expected<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          ::_M_invoke;
            local_198 = ::std::
                        _Function_handler<nonstd::expected_lite::expected<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_nonstd::expected_lite::expected<tinyusdz::Axis,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_(*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        ::_M_manager;
            local_2b0._0_8_ = local_2b0 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"axis","");
            bVar3 = options->strict_allowedToken_check;
            local_1f8 = (code *)0x0;
            pcStack_1f0 = (code *)0x0;
            local_208._M_unused._M_object = (void *)0x0;
            local_208._8_8_ = 0;
            if (local_198 != (code *)0x0) {
              (*local_198)(&local_208,(string *)local_1a8,2);
              local_1f8 = local_198;
              pcStack_1f0 = pcStack_190;
            }
            bVar3 = ParseUniformEnumProperty<tinyusdz::Axis,tinyusdz::Axis>
                              ((string *)local_2b0,bVar3,
                               (EnumHandlerFun<tinyusdz::Axis> *)&local_208,(Attribute *)prop,
                               local_288,local_260,err);
            if (local_1f8 != (code *)0x0) {
              (*local_1f8)(&local_208,&local_208,__destroy_functor);
            }
            psVar1 = (size_type *)(local_2b0 + 0x10);
            if ((size_type *)local_2b0._0_8_ != psVar1) {
              operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
            }
            iVar4 = 1;
            if (bVar3) {
              AttrMetas::operator=(&local_288->_metas,(AttrMetas *)(p_Var9 + 7));
              local_2b0._0_8_ = psVar1;
              ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"axis","");
              ::std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_238,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_2b0);
              if ((size_type *)local_2b0._0_8_ != psVar1) {
                operator_delete((void *)local_2b0._0_8_,local_2b0._16_8_ + 1);
              }
              iVar4 = 3;
            }
            if (local_198 != (code *)0x0) {
              (*local_198)((string *)local_1a8,(string *)local_1a8,3);
            }
            goto LAB_00215f3d;
          }
        }
        else {
LAB_00215f3d:
          if ((iVar4 != 3) && (iVar4 != 0)) {
LAB_00216217:
            bVar13 = false;
            goto LAB_0021621a;
          }
        }
LAB_00215f4c:
        p_Var9 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9);
      } while (p_Var9 != local_248);
      bVar13 = true;
    }
  }
LAB_0021621a:
  ::std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_238,
             (_Link_type)local_238._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  return bVar13;
}

Assistant:

bool ReconstructPrim<GeomCylinder>(
    const Specifier &spec,
    const PropertyMap &properties,
    const ReferenceList &references,
    GeomCylinder *cylinder,
    std::string *warn,
    std::string *err,
    const PrimReconstructOptions &options) {

  (void)warn;
  (void)references;
  (void)options;

  std::set<std::string> table;
  if (!ReconstructGPrimProperties(spec, table, properties, cylinder, warn, err, options.strict_allowedToken_check)) {
    return false;
  }

  for (const auto &prop : properties) {
    DCOUT("prop: " << prop.first);
    PARSE_TYPED_ATTRIBUTE(table, prop, "radius", GeomCylinder,
                         cylinder->radius)
    PARSE_TYPED_ATTRIBUTE(table, prop, "height", GeomCylinder,
                         cylinder->height)
    PARSE_UNIFORM_ENUM_PROPERTY(table, prop, "axis", Axis, AxisEnumHandler, GeomCylinder, cylinder->axis, options.strict_allowedToken_check)
    ADD_PROPERTY(table, prop, GeomCylinder, cylinder->props)
    PARSE_PROPERTY_END_MAKE_ERROR(table, prop)
  }

  return true;
}